

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

int __thiscall
helics::CoreBroker::connect(CoreBroker *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  BrokerBase *this_00;
  long lVar1;
  byte *__src;
  char *__s;
  pointer pcVar2;
  size_type sVar3;
  string_view message;
  string_view message_00;
  bool bVar4;
  int iVar5;
  int *piVar6;
  string *psVar7;
  undefined8 unaff_RBP;
  undefined7 uVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view string1;
  format_args args;
  string_view name;
  string_view string2;
  string_view name_00;
  ActionMessage reg;
  string local_108;
  undefined1 local_e8 [24];
  ulong uStack_d0;
  SmallBuffer local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  uVar8 = (undefined7)((ulong)unaff_RBP >> 8);
  if ((this->super_BrokerBase).brokerState._M_i < CONNECTED) {
    this_00 = &this->super_BrokerBase;
    bVar4 = BrokerBase::transitionBrokerState(this_00,CONFIGURED,CONNECTING);
    if (bVar4) {
      if (8 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        in_R9.values_ = (value<fmt::v11::context> *)0x0;
        message._M_str = "connecting";
        message._M_len = 10;
        name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,9,name,message,false);
      }
      lVar1 = (this->super_BrokerBase).timeout.internalTimeCode;
      (((this->timeoutMon)._M_t.
        super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>.
        _M_t.
        super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>
        .super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl)->timeout).__r =
           (long)((double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000));
      iVar5 = (*(this->super_Broker)._vptr_Broker[0x20])(this);
      if ((char)iVar5 == '\0') {
        BrokerBase::setBrokerState(this_00,CONFIGURED);
        return 0;
      }
      gmlc::concurrency::TriggerVariable::activate(&this->disconnection);
      BrokerBase::setBrokerState(this_00,CONNECTED);
      ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_broker_setup);
      BrokerBase::addActionMessage(this_00,(ActionMessage *)local_e8);
      ActionMessage::~ActionMessage((ActionMessage *)local_e8);
      if (((this->super_BrokerBase).field_0x293 & 1) == 0) {
        ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_reg_broker);
        local_e8._8_4_ = 0x8831d580;
        __src = (byte *)(this->super_BrokerBase).identifier._M_dataplus._M_p;
        local_a8.bufferSize = (this->super_BrokerBase).identifier._M_string_length;
        if ((local_a8.heap != __src) &&
           (SmallBuffer::reserve(&local_a8,local_a8.bufferSize), local_a8.bufferSize != 0)) {
          memcpy(local_a8.heap,__src,local_a8.bufferSize);
        }
        if ((this->super_BrokerBase).no_ping == true) {
          uStack_d0 = uStack_d0 | 0x40000000;
        }
        if ((this->super_BrokerBase).useJsonSerialization == true) {
          uStack_d0 = uStack_d0 | 0x400000;
        }
        if (((this->super_BrokerBase).brokerKey._M_string_length == 0) ||
           (iVar5 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              (&(this->super_BrokerBase).brokerKey,"**"), iVar5 == 0)) {
          psVar7 = getAddress_abi_cxx11_(this);
          __s = (psVar7->_M_dataplus)._M_p;
          sVar3 = psVar7->_M_string_length;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_48,1);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,0,
                     (local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,__s,sVar3);
        }
        else {
          psVar7 = getAddress_abi_cxx11_(this);
          string1._M_str = (psVar7->_M_dataplus)._M_p;
          string1._M_len = psVar7->_M_string_length;
          string2._M_str = (this->super_BrokerBase).brokerKey._M_dataplus._M_p;
          string2._M_len = (this->super_BrokerBase).brokerKey._M_string_length;
          ActionMessage::setStringData((ActionMessage *)local_e8,string1,string2);
        }
        (*(this->super_Broker)._vptr_Broker[0x22])(this,0,local_e8);
        ActionMessage::~ActionMessage((ActionMessage *)local_e8);
      }
      if (5 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        pcVar2 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        sVar3 = (this->super_BrokerBase).identifier._M_string_length;
        psVar7 = getAddress_abi_cxx11_(this);
        local_e8._0_8_ = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        local_e8._8_8_ = (this->super_BrokerBase).identifier._M_string_length;
        local_e8._16_8_ = (psVar7->_M_dataplus)._M_p;
        uStack_d0 = psVar7->_M_string_length;
        fmt.size_ = 0xdd;
        fmt.data_ = (char *)0x19;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)local_e8;
        ::fmt::v11::vformat_abi_cxx11_(&local_108,(v11 *)"Broker {} connected on {}",fmt,args);
        message_00._M_str = local_108._M_dataplus._M_p;
        message_00._M_len = local_108._M_string_length;
        name_00._M_str = pcVar2;
        name_00._M_len = sVar3;
        BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,6,name_00,message_00,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
      }
      iVar5 = (int)CONCAT71(uVar8,1);
      if ((this->super_BrokerBase).configString._M_string_length == 0) {
        return iVar5;
      }
      makeConnections(this,&(this->super_BrokerBase).configString);
      return iVar5;
    }
    if (((this->super_BrokerBase).brokerState._M_i == CONNECTING) &&
       ((this->super_BrokerBase).brokerState._M_i == CONNECTING)) {
      do {
        local_e8._0_8_ = 0;
        local_e8._8_8_ = 20000000;
        do {
          iVar5 = nanosleep((timespec *)local_e8,(timespec *)local_e8);
          if (iVar5 != -1) break;
          piVar6 = __errno_location();
        } while (*piVar6 == 4);
      } while ((this->super_BrokerBase).brokerState._M_i == CONNECTING);
    }
  }
  return (int)CONCAT71(uVar8,(ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) <
                             7);
}

Assistant:

bool CoreBroker::connect()
{
    if (getBrokerState() < BrokerState::CONNECTED) {
        if (transitionBrokerState(BrokerState::CONFIGURED, BrokerState::CONNECTING)) {
            LOG_CONNECTIONS(parent_broker_id, getIdentifier(), "connecting");
            timeoutMon->setTimeout(std::chrono::milliseconds(timeout));
            auto res = brokerConnect();
            if (res) {
                disconnection.activate();
                setBrokerState(BrokerState::CONNECTED);
                addActionMessage(CMD_BROKER_SETUP);
                if (!_isRoot) {
                    ActionMessage reg(CMD_REG_BROKER);
                    reg.source_id = GlobalFederateId{};
                    reg.name(getIdentifier());
                    if (no_ping) {
                        setActionFlag(reg, slow_responding_flag);
                    }
                    if (useJsonSerialization) {
                        setActionFlag(reg, use_json_serialization_flag);
                    }
                    if (!brokerKey.empty() && brokerKey != universalKey) {
                        reg.setStringData(getAddress(), brokerKey);
                    } else {
                        reg.setStringData(getAddress());
                    }
                    transmit(parent_route_id, reg);
                }
                LOG_SUMMARY(parent_broker_id,
                            getIdentifier(),
                            fmt::format("Broker {} connected on {}",
                                        getIdentifier(),
                                        getAddress()));
                if (!configString.empty()) {
                    makeConnections(configString);
                }
            } else {
                setBrokerState(BrokerState::CONFIGURED);
            }
            return res;
        }
        if (getBrokerState() == BrokerState::CONNECTING) {
            while (getBrokerState() == BrokerState::CONNECTING) {
                std::this_thread::sleep_for(std::chrono::milliseconds(20));
            }
        }
    }
    return isConnected();
}